

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sha256.cpp
# Opt level: O2

void Sha256::Private::WriteByteBlock(Sha256 *p)

{
  uint uVar1;
  long lVar2;
  uint auStack_70 [8];
  undefined8 uStack_50;
  UInt32 data32 [16];
  
  for (lVar2 = 10; lVar2 != 0x1a; lVar2 = lVar2 + 1) {
    uVar1 = p->state[lVar2];
    auStack_70[lVar2] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  uStack_50 = 0x106471;
  Transform(p->state,data32);
  return;
}

Assistant:

static void WriteByteBlock(Sha256* p)
  {
    UInt32 data32[16];
    unsigned i;
    for (i = 0; i < 16; i++)
      data32[i] =
        ((UInt32)(p->buffer[i * 4    ]) << 24) +
        ((UInt32)(p->buffer[i * 4 + 1]) << 16) +
        ((UInt32)(p->buffer[i * 4 + 2]) <<  8) +
        ((UInt32)(p->buffer[i * 4 + 3]));
    Transform(p->state, data32);
  }